

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

void version(void)

{
  printf("%s %d.%d.%d\n","gbld",0,2,1);
  exit(0);
}

Assistant:

void version()
{
#ifdef NDEBUG
    printf("%s %d.%d.%d\n", pgm, VERSION_MAJOR, VERSION_MINOR, PATCH);
#else
    printf("%s %d.%d.%d debug\n", pgm, VERSION_MAJOR, VERSION_MINOR, PATCH);
#endif
    exit(EXIT_SUCCESS);
}